

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

int nvpair_append_string_array(nvpair_t *nvp,char *value)

{
  char *nvp_00;
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char *local_28;
  char *str;
  char *value_local;
  nvpair_t *nvp_local;
  
  str = value;
  value_local = (char *)nvp;
  if (nvp == (nvpair_t *)0x0) {
    __assert_fail("(nvp) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x77f,"int nvpair_append_string_array(nvpair_t *, const char *)");
  }
  if (nvp->nvp_magic == 0x6e7670) {
    if (nvp->nvp_type == 10) {
      if (value == (char *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        nvp_local._4_4_ = -1;
      }
      else {
        local_28 = strdup(value);
        nvp_00 = value_local;
        if (local_28 == (char *)0x0) {
          nvp_local._4_4_ = -1;
        }
        else {
          sVar3 = strlen(local_28);
          iVar1 = nvpair_append((nvpair_t *)nvp_00,&local_28,8,sVar3 + 1);
          if (iVar1 == -1) {
            free(local_28);
            nvp_local._4_4_ = -1;
          }
          else {
            nvp_local._4_4_ = 0;
          }
        }
      }
      return nvp_local._4_4_;
    }
    __assert_fail("nvp->nvp_type == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x780,"int nvpair_append_string_array(nvpair_t *, const char *)");
  }
  __assert_fail("(nvp)->nvp_magic == 0x6e7670",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x77f,"int nvpair_append_string_array(nvpair_t *, const char *)");
}

Assistant:

int
nvpair_append_string_array(nvpair_t *nvp, const char *value)
{
	char *str;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);
	if (value == NULL) {
		ERRNO_SET(EINVAL);
		return (-1);
	}
	str = nv_strdup(value);
	if (str == NULL) {
		return (-1);
	}
	if (nvpair_append(nvp, &str, sizeof(str), strlen(str) + 1) == -1) {
		nv_free(str);
		return (-1);
	}
	return (0);
}